

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void transpose_round_shift_flip_8x8(__m128i *in,__m128i *out,int bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  uint uVar12;
  int in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  __m256i bb3;
  __m256i bb2;
  __m256i bb1;
  __m256i bb0;
  __m256i aa3;
  __m256i aa2;
  __m256i aa1;
  __m256i aa0;
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i a3;
  __m256i a2;
  __m256i a1;
  __m256i a0;
  __m256i s37;
  __m256i s26;
  __m256i s15;
  __m256i s04;
  __m256i rounding;
  __m256i c3;
  __m256i c2;
  __m256i c1;
  __m256i c0;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  char local_55c;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar11 = -in_EDX;
  local_55c = (char)uVar11;
  uVar12 = 1 << (local_55c - 1U & 0x1f);
  auVar1 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar12 & 0xffff,7);
  auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,2);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,3);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,4);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,5);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,6);
  auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,7);
  uStack_70 = auVar2._0_8_;
  uStack_68 = auVar2._8_8_;
  auVar10._16_8_ = *(undefined8 *)in_RDI[4];
  auVar10._0_16_ = *in_RDI;
  auVar10._24_8_ = *(undefined8 *)(in_RDI[4] + 8);
  auVar3._16_8_ = uStack_70;
  auVar3._0_16_ = auVar1;
  auVar3._24_8_ = uStack_68;
  auVar3 = vpaddsw_avx2(auVar10,auVar3);
  auVar9._16_8_ = *(undefined8 *)in_RDI[5];
  auVar9._0_16_ = in_RDI[1];
  auVar9._24_8_ = *(undefined8 *)(in_RDI[5] + 8);
  auVar4._16_8_ = uStack_70;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_68;
  auVar4 = vpaddsw_avx2(auVar9,auVar4);
  auVar8._16_8_ = *(undefined8 *)in_RDI[6];
  auVar8._0_16_ = in_RDI[2];
  auVar8._24_8_ = *(undefined8 *)(in_RDI[6] + 8);
  auVar5._16_8_ = uStack_70;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_68;
  auVar5 = vpaddsw_avx2(auVar8,auVar5);
  auVar7._16_8_ = *(undefined8 *)in_RDI[7];
  auVar7._0_16_ = in_RDI[3];
  auVar7._24_8_ = *(undefined8 *)(in_RDI[7] + 8);
  auVar6._16_8_ = uStack_70;
  auVar6._0_16_ = auVar1;
  auVar6._24_8_ = uStack_68;
  auVar6 = vpaddsw_avx2(auVar7,auVar6);
  auVar3 = vpsraw_avx2(auVar3,ZEXT416(uVar11));
  auVar4 = vpsraw_avx2(auVar4,ZEXT416(uVar11));
  auVar5 = vpsraw_avx2(auVar5,ZEXT416(uVar11));
  auVar6 = vpsraw_avx2(auVar6,ZEXT416(uVar11));
  auVar7 = vpunpcklwd_avx2(auVar3,auVar4);
  auVar3 = vpunpckhwd_avx2(auVar3,auVar4);
  auVar8 = vpunpcklwd_avx2(auVar5,auVar6);
  auVar4 = vpunpckhwd_avx2(auVar5,auVar6);
  auVar6 = vpunpckldq_avx2(auVar7,auVar8);
  auVar5 = vpunpckhdq_avx2(auVar7,auVar8);
  auVar7 = vpunpckldq_avx2(auVar3,auVar4);
  auVar3 = vpunpckhdq_avx2(auVar3,auVar4);
  auVar4 = vpermq_avx2(auVar6,0xd8);
  auVar5 = vpermq_avx2(auVar5,0xd8);
  auVar6 = vpermq_avx2(auVar7,0xd8);
  auVar3 = vpermq_avx2(auVar3,0xd8);
  local_580 = auVar4._0_8_;
  uStack_578 = auVar4._8_8_;
  in_RSI[0xe] = local_580;
  in_RSI[0xf] = uStack_578;
  uStack_570 = auVar4._16_8_;
  uStack_568 = auVar4._24_8_;
  in_RSI[0xc] = uStack_570;
  in_RSI[0xd] = uStack_568;
  local_5a0 = auVar5._0_8_;
  uStack_598 = auVar5._8_8_;
  in_RSI[10] = local_5a0;
  in_RSI[0xb] = uStack_598;
  uStack_590 = auVar5._16_8_;
  uStack_588 = auVar5._24_8_;
  in_RSI[8] = uStack_590;
  in_RSI[9] = uStack_588;
  local_5c0 = auVar6._0_8_;
  uStack_5b8 = auVar6._8_8_;
  in_RSI[6] = local_5c0;
  in_RSI[7] = uStack_5b8;
  uStack_5b0 = auVar6._16_8_;
  uStack_5a8 = auVar6._24_8_;
  in_RSI[4] = uStack_5b0;
  in_RSI[5] = uStack_5a8;
  local_5e0 = auVar3._0_8_;
  uStack_5d8 = auVar3._8_8_;
  in_RSI[2] = local_5e0;
  in_RSI[3] = uStack_5d8;
  uStack_5d0 = auVar3._16_8_;
  uStack_5c8 = auVar3._24_8_;
  *in_RSI = uStack_5d0;
  in_RSI[1] = uStack_5c8;
  return;
}

Assistant:

static inline void transpose_round_shift_flip_8x8(__m128i *const in,
                                                  __m128i *const out, int bit) {
  __m256i c0, c1, c2, c3;
  bit = -bit;
  const __m256i rounding = _mm256_set1_epi16(1 << (bit - 1));
  const __m256i s04 =
      _mm256_insertf128_si256(_mm256_castsi128_si256(in[0]), in[4], 0x1);
  const __m256i s15 =
      _mm256_insertf128_si256(_mm256_castsi128_si256(in[1]), in[5], 0x1);
  const __m256i s26 =
      _mm256_insertf128_si256(_mm256_castsi128_si256(in[2]), in[6], 0x1);
  const __m256i s37 =
      _mm256_insertf128_si256(_mm256_castsi128_si256(in[3]), in[7], 0x1);

  const __m256i a0 = _mm256_adds_epi16(s04, rounding);
  const __m256i a1 = _mm256_adds_epi16(s15, rounding);
  const __m256i a2 = _mm256_adds_epi16(s26, rounding);
  const __m256i a3 = _mm256_adds_epi16(s37, rounding);

  // b0: 00 01 02 03  04 05 06 07 | 40 41 42 43  44 45 46 47
  // b1: 10 11 12 13  14 15 16 17 | 50 51 52 53  54 55 56 57
  // b2: 20 21 22 23  24 25 26 27 | 60 61 62 63  64 65 66 67
  // b3: 30 31 32 33  34 35 36 37 | 70 71 72 73  74 75 76 77
  const __m256i b0 = _mm256_srai_epi16(a0, bit);
  const __m256i b1 = _mm256_srai_epi16(a1, bit);
  const __m256i b2 = _mm256_srai_epi16(a2, bit);
  const __m256i b3 = _mm256_srai_epi16(a3, bit);

  TRANSPOSE_8X8_AVX2()

  // Unpack 64 bit elements resulting in:
  // out[7]: 00 10 20 30  40 50 60 70
  // out[6]: 01 11 21 31  41 51 61 71
  // out[5]: 02 12 22 32  42 52 62 72
  // out[4]: 03 13 23 33  43 53 63 73
  // out[3]: 04 14 24 34  44 54 64 74
  // out[2]: 05 15 25 35  45 55 65 75
  // out[1]: 06 16 26 36  46 56 66 76
  // out[0]: 07 17 27 37  47 57 67 77
  out[7] = _mm256_castsi256_si128(c0);
  out[6] = _mm256_extractf128_si256(c0, 1);
  out[5] = _mm256_castsi256_si128(c1);
  out[4] = _mm256_extractf128_si256(c1, 1);
  out[3] = _mm256_castsi256_si128(c2);
  out[2] = _mm256_extractf128_si256(c2, 1);
  out[1] = _mm256_castsi256_si128(c3);
  out[0] = _mm256_extractf128_si256(c3, 1);
}